

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap.cpp
# Opt level: O3

int __thiscall QPixmap::copy(QPixmap *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined1 auVar1 [16];
  QPlatformPixmap *d;
  long *plVar2;
  long in_FS_OFFSET;
  int iVar4;
  undefined1 auVar3 [16];
  QRect QVar5;
  QRect local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  plVar2 = *(long **)(dst + 0x10);
  if ((plVar2 == (long *)0x0) || (*(char *)((long)plVar2 + 0x14) == '\x01')) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
LAB_002add83:
      __stack_chk_fail();
    }
    QPixmap(this);
  }
  else {
    local_30.x1.m_i = 0;
    local_30.y1.m_i = 0;
    local_30._8_8_ = CONCAT44((int)((ulong)plVar2[1] >> 0x20) + -1,(int)plVar2[1] + -1);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_30._8_8_;
    QVar5 = (QRect)(auVar1 << 0x40);
    auVar3._0_4_ = -(uint)((int)*(undefined8 *)(src + 8) < (int)*(undefined8 *)src);
    iVar4 = -(uint)((int)((ulong)*(undefined8 *)(src + 8) >> 0x20) <
                   (int)((ulong)*(undefined8 *)src >> 0x20));
    auVar3._4_4_ = auVar3._0_4_;
    auVar3._8_4_ = iVar4;
    auVar3._12_4_ = iVar4;
    iVar4 = movmskpd((int)local_20,auVar3);
    if (iVar4 == 0) {
      QVar5 = (QRect)QRect::operator&(&local_30,(QRect *)src);
      plVar2 = *(long **)(dst + 0x10);
    }
    local_30 = QVar5;
    d = (QPlatformPixmap *)(**(code **)(*plVar2 + 0x10))();
    (*d->_vptr_QPlatformPixmap[9])(d,*(undefined8 *)(dst + 0x10),&local_30);
    QPixmap(this,d);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_002add83;
  }
  return (int)this;
}

Assistant:

QPixmap QPixmap::copy(const QRect &rect) const
{
    if (isNull())
        return QPixmap();

    QRect r(0, 0, width(), height());
    if (!rect.isEmpty())
        r = r.intersected(rect);

    QPlatformPixmap *d = data->createCompatiblePlatformPixmap();
    d->copy(data.data(), r);
    return QPixmap(d);
}